

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::AddMessage
          (RepeatedPtrFieldBase *this,MessageLite *prototype)

{
  Arena *arena;
  bool bVar1;
  int __old_val;
  int iVar2;
  void **ppvVar3;
  MessageLite *pMVar4;
  Rep *pRVar5;
  int iVar6;
  
  pMVar4 = (MessageLite *)this->tagged_rep_or_elem_;
  arena = this->arena_;
  if (pMVar4 == (MessageLite *)0x0) {
    this->current_size_ = 1;
    pMVar4 = MessageLite::New(prototype,arena);
    this->tagged_rep_or_elem_ = pMVar4;
  }
  else if (((ulong)pMVar4 & 1) == 0) {
    if (this->current_size_ == 0) {
      this->current_size_ = 1;
    }
    else {
      ppvVar3 = InternalExtend(this,1);
      pMVar4 = MessageLite::New(prototype,arena);
      *ppvVar3 = pMVar4;
      pRVar5 = rep(this);
      pRVar5->allocated_size = 2;
      this->current_size_ = 2;
      pMVar4 = (MessageLite *)*ppvVar3;
    }
  }
  else {
    pRVar5 = rep(this);
    bVar1 = SizeAtCapacity(this);
    if (bVar1) {
      InternalExtend(this,1);
      pRVar5 = rep(this);
      iVar2 = this->current_size_;
      iVar6 = pRVar5->allocated_size;
    }
    else {
      iVar2 = this->current_size_;
      iVar6 = iVar2;
      if (iVar2 != pRVar5->allocated_size) {
        this->current_size_ = iVar2 + 1;
        return (MessageLite *)pRVar5->elements[iVar2];
      }
    }
    pRVar5->allocated_size = iVar6 + 1;
    this->current_size_ = iVar2 + 1;
    pMVar4 = MessageLite::New(prototype,arena);
    pRVar5->elements[iVar2] = pMVar4;
  }
  return pMVar4;
}

Assistant:

MessageLite* RepeatedPtrFieldBase::AddMessage(const MessageLite* prototype) {
  return static_cast<MessageLite*>(
      AddInternal([prototype](Arena* a) { return prototype->New(a); }));
}